

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O3

void __thiscall QFormLayout::~QFormLayout(QFormLayout *this)

{
  QLayoutItem *this_00;
  
  this_00 = &this[-1].super_QLayout.super_QLayoutItem;
  ~QFormLayout((QFormLayout *)this_00);
  operator_delete(this_00,0x20);
  return;
}

Assistant:

QFormLayout::~QFormLayout()
{
    Q_D(QFormLayout);

    /*
        The clearing and destruction order here is important. We start by clearing
        m_things so that QLayout and the rest of the world know that we don't babysit
        the layout items anymore and don't care if they are destroyed.
    */
    d->m_things.clear();
    qDeleteAll(d->m_matrix.storage());
    d->m_matrix.clear();
}